

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O2

void duckdb::MedianAbsoluteDeviationOperation<double>::
     Finalize<double,duckdb::QuantileState<double,duckdb::QuantileStandardType>>
               (QuantileState<double,_duckdb::QuantileStandardType> *state,double *target,
               AggregateFinalizeData *finalize_data)

{
  long lVar1;
  double *v_t;
  FunctionData *pFVar2;
  reference pvVar3;
  idx_t iVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  MadAccessor<double,_double,_double> accessor;
  double med;
  Interpolator<false> interp;
  MadAccessor<double,_double,_double> local_70;
  double local_68;
  Interpolator<false> local_60;
  
  if ((state->v).super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (state->v).super_vector<double,_std::allocator<double>_>.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    pvVar3 = vector<duckdb::QuantileValue,_true>::get<true>
                       ((vector<duckdb::QuantileValue,_true> *)(pFVar2 + 1),0);
    v_t = (state->v).super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start;
    iVar4 = (long)(state->v).super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)v_t >> 3;
    local_60.desc = false;
    lVar1 = iVar4 - 1;
    auVar7._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar7._0_8_ = lVar1;
    auVar7._12_4_ = 0x45300000;
    dVar5 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * pvVar3->dbl;
    local_60.RN = dVar5;
    dVar6 = floor(dVar5);
    local_60.FRN = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
    dVar5 = ceil(dVar5);
    local_60.CRN = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
    local_60.begin = 0;
    local_60.end = iVar4;
    local_68 = Interpolator<false>::Operation<double,double,duckdb::QuantileDirect<double>>
                         (&local_60,v_t,finalize_data->result,(QuantileDirect<double> *)&local_68);
    local_70.median = &local_68;
    dVar5 = Interpolator<false>::Operation<double,double,duckdb::MadAccessor<double,double,double>>
                      (&local_60,
                       (state->v).super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start,finalize_data->result,&local_70);
    *target = dVar5;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		using INPUT_TYPE = typename STATE::InputType;
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &q = bind_data.quantiles[0];
		Interpolator<false> interp(q, state.v.size(), false);
		const auto med = interp.template Operation<INPUT_TYPE, MEDIAN_TYPE>(state.v.data(), finalize_data.result);

		MadAccessor<INPUT_TYPE, T, MEDIAN_TYPE> accessor(med);
		target = interp.template Operation<INPUT_TYPE, T>(state.v.data(), finalize_data.result, accessor);
	}